

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O0

void __thiscall CDesign::SetState(CDesign *this,int iState)

{
  int iState_local;
  CDesign *this_local;
  
  if (iState == -0x41) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState & 0xffffffbf;
  }
  else if (iState == -2) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState & 0xfffffffe;
  }
  else if (iState == 1) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 1;
  }
  else if (iState == 2) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 2;
    (this->super_CObject).m_iState = (this->super_CObject).m_iState & 0xfffffff7;
  }
  else if (iState == 4) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 4;
    (this->super_CObject).m_iState = (this->super_CObject).m_iState & 0xffffffef;
  }
  else if (iState == 8) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 8;
    (this->super_CObject).m_iState = (this->super_CObject).m_iState & 0xfffffffd;
  }
  else if (iState == 0x10) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState & 0xfffffffb;
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 0x10;
  }
  else if (iState == 0x20) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 0x20;
    CObject::Display(0,"routing success!\n");
  }
  else if (iState == 0x40) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 0x40;
  }
  else {
    if (iState != 0x80) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x71e,"void CDesign::SetState(int)");
    }
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 0x80;
  }
  return;
}

Assistant:

void CDesign::SetState(int iState)
{
	switch(iState){
	//case STATE_DESN_CONVERGING:
	//	m_iState	|=	STATE_DESN_CONVERGING;
	//	break;
	case STATE_DESN_COMPLETED:
		m_iState	|=	STATE_DESN_COMPLETED;
		break;
	case STATE_DESN_STUCK:
		m_iState	|=	STATE_DESN_STUCK;
		break;
	case ~STATE_DESN_STUCK:
		m_iState	&=	~STATE_DESN_STUCK;
		break;
	case STATE_DESN_SUCCESS:
		m_iState	|=	STATE_DESN_SUCCESS;
		//m_iState	&=	~STATE_DESN_STUCK;
		Display(DISPLAY_MODE_INFO,"routing success!\n");
		break;
	case STATE_DESN_REROUTING:	//design is being rerouted
		m_iState	&=	~STATE_DESN_REROUTED;
		m_iState	|=	STATE_DESN_REROUTING;
		break;
	case STATE_DESN_REROUTED:	//design is rerouted
		m_iState	|=	STATE_DESN_REROUTED;
		m_iState	&=	~STATE_DESN_REROUTING;
		break;
	case STATE_DESN_ROUTING:	//design is being routed
		m_iState	|=	STATE_DESN_ROUTING;
		m_iState	&=	~STATE_DESN_ROUTED;
		break;
	case STATE_DESN_OVERFLOW:	//design has overflow
		m_iState	|=	STATE_DESN_OVERFLOW;
		break;
	case ~STATE_DESN_OVERFLOW:	//the overflow in the design is removed
		m_iState	&=	~STATE_DESN_OVERFLOW;
		break;
	case STATE_DESN_ROUTED:		//design is routed
		m_iState	|=	STATE_DESN_ROUTED;
		m_iState	&=	~STATE_DESN_ROUTING;
		break;
	default:
		assert(FALSE);
		break;
	}
}